

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O2

void __thiscall KDIS::KException::KException(KException *this,KString *Text,KUINT16 EC)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  *(undefined ***)this = &PTR__KException_00213c40;
  this->m_ui16ErrorCode = EC;
  std::operator+(&local_38,Text,": ");
  switch(EC) {
  case 0:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"No Errors. ",&local_59);
    break;
  case 1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Buffer Is Too Small. ",&local_59);
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Buffer Does Not Contain Enough Information To Decode. ",
               &local_59);
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"String Size Too Big. ",&local_59);
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Data Type Is Too Large. ",&local_59);
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Incorrect PDU Type Specified In Header. ",&local_59);
    break;
  case 6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Could Not Open File For Reading/Writing. ",&local_59);
    break;
  case 7:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Parameter Is Out Of Bounds/Range Of Acceptable Values. ",
               &local_59);
    break;
  case 8:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Invalid Data. ",&local_59);
    break;
  case 9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unsupported Data Type, Can Not Decode. ",&local_59);
    break;
  case 10:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Invalid Operation. ",&local_59);
    break;
  case 0xb:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.",&local_59);
    break;
  case 0xc:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Socket error.",&local_59);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unknown KDIS Error. ",&local_59);
  }
  std::operator+(&this->m_sErrorText,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC) :
        m_ui16ErrorCode( EC ),
        m_sErrorText( Text + ": " + GetErrorText( EC ) )
    {
    }